

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

Iterator *
leveldb::NewDBIterator
          (DBImpl *db,Comparator *user_key_comparator,Iterator *internal_iter,
          SequenceNumber sequence,uint32_t seed)

{
  DBIter *this;
  uint32_t seed_local;
  SequenceNumber sequence_local;
  Iterator *internal_iter_local;
  Comparator *user_key_comparator_local;
  DBImpl *db_local;
  
  this = (DBIter *)operator_new(0xa8);
  anon_unknown_3::DBIter::DBIter(this,db,user_key_comparator,internal_iter,sequence,seed);
  return &this->super_Iterator;
}

Assistant:

Iterator* NewDBIterator(DBImpl* db, const Comparator* user_key_comparator,
                        Iterator* internal_iter, SequenceNumber sequence,
                        uint32_t seed) {
  return new DBIter(db, user_key_comparator, internal_iter, sequence, seed);
}